

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

mFILE * mfreopen(char *path,char *mode_str,FILE *fp)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  mFILE *pmVar6;
  int binary;
  undefined8 in_RCX;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  
  pcVar1 = strchr(mode_str,0x72);
  pcVar2 = strchr(mode_str,0x77);
  uVar7 = (uint)(pcVar1 != (char *)0x0);
  uVar8 = uVar7 + 0x12;
  if (pcVar2 == (char *)0x0) {
    uVar8 = uVar7;
  }
  pcVar3 = strchr(mode_str,0x61);
  bVar9 = pcVar3 != (char *)0x0;
  uVar7 = uVar8 | 6;
  if (!bVar9) {
    uVar7 = uVar8;
  }
  pcVar4 = strchr(mode_str,0x62);
  uVar8 = uVar7 + 8;
  if (pcVar4 == (char *)0x0) {
    uVar8 = uVar7;
  }
  pcVar4 = strchr(mode_str,0x78);
  pcVar5 = strchr(mode_str,0x2b);
  bVar10 = pcVar5 != (char *)0x0;
  uVar7 = uVar8 | 3;
  if (!bVar10) {
    uVar7 = uVar8;
  }
  binary = (int)CONCAT71((int7)((ulong)in_RCX >> 8),bVar10 && bVar9);
  if (pcVar1 != (char *)0x0 || bVar10 && bVar9) {
    pmVar6 = mfcreate((char *)0x0,0);
    if (pmVar6 == (mFILE *)0x0) {
      return (mFILE *)0x0;
    }
    if ((uVar7 & 0x10) == 0) {
      pcVar1 = mfload(fp,path,&pmVar6->size,binary);
      pmVar6->data = pcVar1;
      pmVar6->alloced = pmVar6->size;
      if (pcVar3 == (char *)0x0) {
        fseek((FILE *)fp,0,0);
      }
    }
  }
  else {
    if ((pcVar5 == (char *)0x0 && pcVar3 == (char *)0x0) && pcVar2 == (char *)0x0) {
      fwrite("Must specify either r, w or a for mode\n",0x27,1,_stderr);
      return (mFILE *)0x0;
    }
    pmVar6 = mfcreate((char *)0x0,0);
    if (pmVar6 == (mFILE *)0x0) {
      return (mFILE *)0x0;
    }
  }
  uVar8 = uVar7 | 0x20;
  if (pcVar4 == (char *)0x0) {
    uVar8 = uVar7;
  }
  pmVar6->fp = fp;
  pmVar6->mode = uVar8;
  if (pcVar3 != (char *)0x0) {
    pmVar6->flush_pos = pmVar6->size;
    fseek((FILE *)fp,0,2);
  }
  return pmVar6;
}

Assistant:

mFILE *mfreopen(const char *path, const char *mode_str, FILE *fp) {
    mFILE *mf;
    int r = 0, w = 0, a = 0, b = 0, x = 0, mode = 0;

    /* Parse mode:
     * r = read file contents (if truncated => don't read)
     * w = write on close
     * a = position at end of buffer
     * x = position at same location as the original fp, don't seek on flush
     */
    if (strchr(mode_str, 'r'))
	r = 1, mode |= MF_READ;
    if (strchr(mode_str, 'w'))
	w = 1, mode |= MF_WRITE | MF_TRUNC;
    if (strchr(mode_str, 'a'))
	w = a = 1, mode |= MF_WRITE | MF_APPEND;
    if (strchr(mode_str, 'b'))
	b = 1, mode |= MF_BINARY;
    if (strchr(mode_str, 'x'))
	x = 1;
    if (strchr(mode_str, '+')) {
        w = 1, mode |= MF_READ | MF_WRITE;
	if (a)
	    r = 1;
    }

    if (r) {
	mf = mfcreate(NULL, 0);
	if (NULL == mf) return NULL;
	if (!(mode & MF_TRUNC)) {
	    mf->data = mfload(fp, path, &mf->size, b);
	    mf->alloced = mf->size;
	    if (!a)
		fseek(fp, 0, SEEK_SET);
	}
    } else if (w) {
	/* Write - initialise the data structures */
	mf = mfcreate(NULL, 0);
	if (NULL == mf) return NULL;
    } else {
        fprintf(stderr, "Must specify either r, w or a for mode\n");
        return NULL;
    }
    mf->fp = fp;
    mf->mode = mode;

    if (x) {
	mf->mode |= MF_MODEX;
    }
    
    if (a) {
	mf->flush_pos = mf->size;
	fseek(fp, 0, SEEK_END);
    }

    return mf;
}